

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode output_auth_headers(connectdata *conn,auth *authstatus,char *request,char *path,_Bool proxy
                            )

{
  Curl_easy *data;
  unsigned_long uVar1;
  Curl_easy *data_00;
  long lVar2;
  CURLcode CVar3;
  char *pcVar4;
  size_t insize;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char **ppcVar8;
  char *authorization;
  size_t size;
  char *local_48;
  long local_40;
  size_t local_38;
  
  data = conn->data;
  uVar1 = authstatus->picked;
  if (uVar1 != 1) {
    if (uVar1 == 2) {
      CVar3 = Curl_output_digest(conn,proxy,(uchar *)request,(uchar *)path);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      pcVar7 = "Digest";
    }
    else if (uVar1 == 8) {
      CVar3 = Curl_output_ntlm(conn,proxy);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      pcVar7 = "NTLM";
    }
    else {
      pcVar7 = (char *)0x0;
    }
    goto LAB_0056cd26;
  }
  if (proxy) {
    if ((((conn->bits).field_0x5 & 1) == 0) ||
       (pcVar7 = Curl_checkProxyheaders(conn,"Proxy-authorization"), pcVar7 != (char *)0x0)) {
      if (!proxy) goto LAB_0056ccef;
      goto LAB_0056cd11;
    }
LAB_0056ce1a:
    local_38 = 0;
    local_48 = (char *)0x0;
    data_00 = conn->data;
    ppcVar8 = &conn->user;
    ppcVar5 = &conn->passwd;
    local_40 = 0x420;
    if (proxy) {
      local_40 = 0x408;
      ppcVar5 = &(conn->http_proxy).passwd;
      ppcVar8 = &(conn->http_proxy).user;
    }
    pcVar7 = curl_maprintf("%s:%s",*ppcVar8,*ppcVar5);
    if (pcVar7 == (char *)0x0) {
      CVar3 = CURLE_OUT_OF_MEMORY;
    }
    else {
      insize = strlen(pcVar7);
      CVar3 = Curl_base64_encode(data_00,pcVar7,insize,&local_48,&local_38);
      lVar2 = local_40;
      if (CVar3 == CURLE_OK) {
        if (local_48 == (char *)0x0) {
          CVar3 = CURLE_REMOTE_ACCESS_DENIED;
        }
        else {
          (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + local_40 + -0x20));
          pcVar4 = "";
          if (proxy) {
            pcVar4 = "Proxy-";
          }
          pcVar4 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar4,local_48);
          *(char **)((conn->chunk).hexbuffer + lVar2 + -0x20) = pcVar4;
          (*Curl_cfree)(local_48);
          CVar3 = CURLE_OUT_OF_MEMORY;
          if (*(long *)((conn->chunk).hexbuffer + lVar2 + -0x20) != 0) {
            CVar3 = CURLE_OK;
          }
        }
      }
      (*Curl_cfree)(pcVar7);
    }
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    pcVar7 = "Basic";
  }
  else {
LAB_0056ccef:
    if ((((conn->bits).field_0x4 & 0x80) != 0) &&
       (pcVar7 = Curl_checkheaders(conn,"Authorization"), pcVar7 == (char *)0x0)) goto LAB_0056ce1a;
LAB_0056cd11:
    pcVar7 = (char *)0x0;
  }
  authstatus->field_0x18 = authstatus->field_0x18 | 1;
LAB_0056cd26:
  if (authstatus->picked == 0x40) {
    if (((!proxy) && (conn->oauth_bearer != (char *)0x0)) &&
       (pcVar4 = Curl_checkheaders(conn,"Authorization:"), pcVar4 == (char *)0x0)) {
      (*Curl_cfree)((conn->allocptr).userpwd);
      pcVar7 = curl_maprintf("Authorization: Bearer %s\r\n",conn->oauth_bearer);
      (conn->allocptr).userpwd = pcVar7;
      if (pcVar7 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar7 = "Bearer";
    }
    authstatus->field_0x18 = authstatus->field_0x18 | 1;
  }
  if (pcVar7 == (char *)0x0) {
    authstatus->field_0x18 = authstatus->field_0x18 & 0xfd;
  }
  else {
    pcVar4 = "Server";
    ppcVar8 = &conn->user;
    if (proxy) {
      pcVar4 = "Proxy";
      ppcVar8 = &(conn->http_proxy).user;
    }
    pcVar6 = "";
    if (*ppcVar8 != (char *)0x0) {
      pcVar6 = *ppcVar8;
    }
    Curl_infof(data,"%s auth using %s with user \'%s\'\n",pcVar4,pcVar7,pcVar6);
    authstatus->field_0x18 =
         (authstatus->field_0x18 & 0xfd | authstatus->field_0x18 * '\x02' & 2U) ^ 2;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode
output_auth_headers(struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS) || defined(USE_SPNEGO)
  struct Curl_easy *data = conn->data;
#endif

#ifdef CURL_DISABLE_CRYPTO_AUTH
  (void)request;
  (void)path;
#endif

#ifdef USE_SPNEGO
  if((authstatus->picked == CURLAUTH_NEGOTIATE)) {
    auth = "Negotiate";
    result = Curl_output_negotiate(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  if(authstatus->picked == CURLAUTH_NTLM_WB) {
    auth = "NTLM_WB";
    result = Curl_output_ntlm_wb(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(conn,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if((proxy && conn->bits.proxy_user_passwd &&
        !Curl_checkProxyheaders(conn, "Proxy-authorization")) ||
       (!proxy && conn->bits.user_passwd &&
        !Curl_checkheaders(conn, "Authorization"))) {
      auth = "Basic";
      result = http_output_basic(conn, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
  if(authstatus->picked == CURLAUTH_BEARER) {
    /* Bearer */
    if((!proxy && conn->oauth_bearer &&
        !Curl_checkheaders(conn, "Authorization:"))) {
      auth = "Bearer";
      result = http_output_bearer(conn);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }

  if(auth) {
    infof(data, "%s auth using %s with user '%s'\n",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (conn->http_proxy.user ? conn->http_proxy.user : "") :
                  (conn->user ? conn->user : ""));
    authstatus->multipass = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multipass = FALSE;

  return CURLE_OK;
}